

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O1

void * __thiscall RelocEntryWrapper::getPtr(RelocEntryWrapper *this)

{
  size_t sVar1;
  void *pvVar2;
  void *pvVar3;
  
  if ((this->parentDir == (RelocBlockWrapper *)0x0) ||
     (sVar1 = RelocBlockWrapper::maxEntriesNumInBlock(this->parentDir),
     sVar1 <= (this->super_ExeNodeWrapper).entryNum)) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar2 = RelocBlockWrapper::getEntriesPtr(this->parentDir);
    pvVar3 = (void *)((long)pvVar2 + (this->super_ExeNodeWrapper).entryNum * 2);
    if (pvVar2 == (void *)0x0) {
      pvVar3 = (void *)0x0;
    }
  }
  return pvVar3;
}

Assistant:

void* RelocEntryWrapper::getPtr()
{
    if (this->parentDir == NULL) return NULL;

    size_t maxNum = this->parentDir->maxEntriesNumInBlock();
    if (this->entryNum >=  maxNum) return NULL;

    WORD* entriesPtr = (WORD* ) parentDir->getEntriesPtr();
    if (entriesPtr == NULL) return NULL;

    WORD* ptr = &entriesPtr[this->entryNum];
    return ptr;
}